

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::GetThisHelper
              (Var thisVar,TypeId typeId,int moduleID,ScriptContextInfo *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  JITManager *this;
  undefined4 *puVar4;
  ScriptContextInfo *scriptContext_local;
  int moduleID_local;
  TypeId typeId_local;
  Var thisVar_local;
  
  _moduleID_local = thisVar;
  BVar3 = IsObjectType(typeId);
  if ((BVar3 == 0) && (BVar3 = IsUndefinedOrNullType(typeId), BVar3 == 0)) {
    this = JITManager::GetJITManager();
    bVar2 = JITManager::IsJITServer(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x157f,"(!JITManager::GetJITManager()->IsJITServer())",
                                  "!JITManager::GetJITManager()->IsJITServer()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    thisVar_local = ToObject(_moduleID_local,(ScriptContext *)scriptContext);
  }
  else {
    TryLoadRoot((Var *)&moduleID_local,typeId,moduleID,scriptContext);
    thisVar_local = _moduleID_local;
  }
  return thisVar_local;
}

Assistant:

Var JavascriptOperators::GetThisHelper(Var thisVar, TypeId typeId, int moduleID, ScriptContextInfo *scriptContext)
    {
        if (! JavascriptOperators::IsObjectType(typeId) && ! JavascriptOperators::IsUndefinedOrNullType(typeId))
        {
#if ENABLE_NATIVE_CODEGEN
            Assert(!JITManager::GetJITManager()->IsJITServer());
#endif
#if !FLOATVAR
            // We allowed stack number to be used as the "this" for getter and setter activation of
            // n.x and n[prop], where n is the Javascript Number
            return JavascriptOperators::ToObject(
                JavascriptNumber::BoxStackNumber(thisVar, (ScriptContext*)scriptContext), (ScriptContext*)scriptContext);
#else
            return JavascriptOperators::ToObject(thisVar, (ScriptContext*)scriptContext);
#endif

        }
        else
        {
            TryLoadRoot(thisVar, typeId, moduleID, scriptContext);
            return thisVar;
        }
    }